

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void updateAccumulator(Parse *pParse,int regAcc,AggInfo *pAggInfo)

{
  Vdbe *p;
  FKey *pList_00;
  int local_74;
  ExprList_item *pEStack_70;
  int j;
  ExprList_item *pItem;
  CollSeq *pColl;
  ExprList *pList;
  int local_50;
  int regAgg;
  int addrNext;
  int nArg;
  AggInfo_col *pC;
  AggInfo_func *pF;
  int local_30;
  int addrHitTest;
  int regHit;
  int i;
  Vdbe *v;
  AggInfo *pAggInfo_local;
  int regAcc_local;
  Parse *pParse_local;
  
  p = pParse->pVdbe;
  local_30 = 0;
  pF._4_4_ = 0;
  pAggInfo->directMode = '\x01';
  addrHitTest = 0;
  pC = (AggInfo_col *)pAggInfo->aFunc;
  for (; addrHitTest < pAggInfo->nFunc; addrHitTest = addrHitTest + 1) {
    local_50 = 0;
    pList_00 = pC->pTab->pFKey;
    if (pList_00 == (FKey *)0x0) {
      regAgg = 0;
      pList._4_4_ = 0;
    }
    else {
      regAgg = *(int *)&pList_00->pFrom;
      pList._4_4_ = sqlite3GetTempRange(pParse,regAgg);
      sqlite3ExprCodeExprList(pParse,(ExprList *)pList_00,pList._4_4_,0,'\x01');
    }
    if (-1 < pC->iMem) {
      local_50 = sqlite3VdbeMakeLabel(pParse);
      codeDistinct(pParse,pC->iMem,local_50,1,pList._4_4_);
    }
    if ((*(uint *)(*(long *)&pC->iTable + 4) & 0x20) != 0) {
      pItem = (ExprList_item *)0x0;
      pEStack_70 = (ExprList_item *)&pList_00->pNextFrom;
      for (local_74 = 0; pItem == (ExprList_item *)0x0 && local_74 < regAgg; local_74 = local_74 + 1
          ) {
        pItem = (ExprList_item *)sqlite3ExprCollSeq(pParse,pEStack_70->pExpr);
        pEStack_70 = pEStack_70 + 1;
      }
      if (pItem == (ExprList_item *)0x0) {
        pItem = (ExprList_item *)pParse->db->pDfltColl;
      }
      if ((local_30 == 0) && (pAggInfo->nAccumulator != 0)) {
        local_30 = pParse->nMem + 1;
        pParse->nMem = local_30;
      }
      sqlite3VdbeAddOp4(p,0x52,local_30,0,0,(char *)pItem,-2);
    }
    sqlite3VdbeAddOp3(p,0x9a,0,pList._4_4_,pC->iSorterColumn);
    sqlite3VdbeAppendP4(p,*(void **)&pC->iTable,-8);
    sqlite3VdbeChangeP5(p,(ushort)regAgg & 0xff);
    sqlite3ReleaseTempRange(pParse,pList._4_4_,regAgg);
    if (local_50 != 0) {
      sqlite3VdbeResolveLabel(p,local_50);
    }
    pC = (AggInfo_col *)&pC->pExpr;
  }
  if ((local_30 == 0) && (pAggInfo->nAccumulator != 0)) {
    local_30 = regAcc;
  }
  if (local_30 != 0) {
    pF._4_4_ = sqlite3VdbeAddOp1(p,0x12,local_30);
  }
  addrHitTest = 0;
  _addrNext = pAggInfo->aCol;
  for (; addrHitTest < pAggInfo->nAccumulator; addrHitTest = addrHitTest + 1) {
    sqlite3ExprCode(pParse,_addrNext->pExpr,_addrNext->iMem);
    _addrNext = _addrNext + 1;
  }
  pAggInfo->directMode = '\0';
  if (pF._4_4_ != 0) {
    sqlite3VdbeJumpHere(p,pF._4_4_);
  }
  return;
}

Assistant:

static void updateAccumulator(Parse *pParse, int regAcc, AggInfo *pAggInfo){
  Vdbe *v = pParse->pVdbe;
  int i;
  int regHit = 0;
  int addrHitTest = 0;
  struct AggInfo_func *pF;
  struct AggInfo_col *pC;

  pAggInfo->directMode = 1;
  for(i=0, pF=pAggInfo->aFunc; i<pAggInfo->nFunc; i++, pF++){
    int nArg;
    int addrNext = 0;
    int regAgg;
    ExprList *pList = pF->pExpr->x.pList;
    assert( !ExprHasProperty(pF->pExpr, EP_xIsSelect) );
    if( pList ){
      nArg = pList->nExpr;
      regAgg = sqlite3GetTempRange(pParse, nArg);
      sqlite3ExprCodeExprList(pParse, pList, regAgg, 0, SQLITE_ECEL_DUP);
    }else{
      nArg = 0;
      regAgg = 0;
    }
    if( pF->iDistinct>=0 ){
      addrNext = sqlite3VdbeMakeLabel(pParse);
      testcase( nArg==0 );  /* Error condition */
      testcase( nArg>1 );   /* Also an error */
      codeDistinct(pParse, pF->iDistinct, addrNext, 1, regAgg);
    }
    if( pF->pFunc->funcFlags & SQLITE_FUNC_NEEDCOLL ){
      CollSeq *pColl = 0;
      struct ExprList_item *pItem;
      int j;
      assert( pList!=0 );  /* pList!=0 if pF->pFunc has NEEDCOLL */
      for(j=0, pItem=pList->a; !pColl && j<nArg; j++, pItem++){
        pColl = sqlite3ExprCollSeq(pParse, pItem->pExpr);
      }
      if( !pColl ){
        pColl = pParse->db->pDfltColl;
      }
      if( regHit==0 && pAggInfo->nAccumulator ) regHit = ++pParse->nMem;
      sqlite3VdbeAddOp4(v, OP_CollSeq, regHit, 0, 0, (char *)pColl, P4_COLLSEQ);
    }
    sqlite3VdbeAddOp3(v, OP_AggStep, 0, regAgg, pF->iMem);
    sqlite3VdbeAppendP4(v, pF->pFunc, P4_FUNCDEF);
    sqlite3VdbeChangeP5(v, (u8)nArg);
    sqlite3ReleaseTempRange(pParse, regAgg, nArg);
    if( addrNext ){
      sqlite3VdbeResolveLabel(v, addrNext);
    }
  }
  if( regHit==0 && pAggInfo->nAccumulator ){
    regHit = regAcc;
  }
  if( regHit ){
    addrHitTest = sqlite3VdbeAddOp1(v, OP_If, regHit); VdbeCoverage(v);
  }
  for(i=0, pC=pAggInfo->aCol; i<pAggInfo->nAccumulator; i++, pC++){
    sqlite3ExprCode(pParse, pC->pExpr, pC->iMem);
  }
  pAggInfo->directMode = 0;
  if( addrHitTest ){
    sqlite3VdbeJumpHere(v, addrHitTest);
  }
}